

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeIT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ulong Val;
  DecodeStatus DVar1;
  uint uVar2;
  
  if ((Insn & 0xf) == 0) {
    DVar1 = MCDisassembler_Fail;
  }
  else {
    uVar2 = Insn >> 4 & 0xf;
    Val = 0xe;
    if (uVar2 != 0xf) {
      Val = (ulong)uVar2;
    }
    DVar1 = (uint)(uVar2 != 0xf) * 2 + MCDisassembler_SoftFail;
    MCOperand_CreateImm0(Inst,Val);
    MCOperand_CreateImm0(Inst,(ulong)(Insn & 0xf));
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeIT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred = fieldFromInstruction_4(Insn, 4, 4);
	unsigned mask = fieldFromInstruction_4(Insn, 0, 4);

	if (pred == 0xF) {
		pred = 0xE;
		S = MCDisassembler_SoftFail;
	}

	if (mask == 0x0)
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, pred);
	MCOperand_CreateImm0(Inst, mask);
	return S;
}